

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O0

bool __thiscall ServerManager::addServer(ServerManager *this,string_view serverConfig)

{
  Config *pCVar1;
  byte bVar2;
  bool bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  size_t local_60;
  char *local_58;
  Config *local_38;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> local_30;
  __single_object server;
  ServerManager *this_local;
  string_view serverConfig_local;
  
  server._M_t.super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
  super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
  super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl =
       (__uniq_ptr_data<IRC_Bot,_std::default_delete<IRC_Bot>,_true,_true>)
       (__uniq_ptr_data<IRC_Bot,_std::default_delete<IRC_Bot>,_true,_true>)this;
  local_38 = (Config *)
             Jupiter::Config::getSection(this->m_config,serverConfig._M_len,serverConfig._M_str);
  pCVar1 = this->m_config;
  bVar4 = sv("Default",7);
  local_60 = bVar4._M_len;
  local_58 = bVar4._M_str;
  Jupiter::Config::getSection(pCVar1,local_60,local_58);
  std::make_unique<IRC_Bot,Jupiter::Config*,Jupiter::Config*>((Config **)&local_30,&local_38);
  std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::operator->(&local_30);
  bVar2 = Jupiter::IRC::Client::connect();
  bVar3 = (bVar2 & 1) != 0;
  if (bVar3) {
    std::
    vector<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
    ::push_back(&this->m_servers,&local_30);
  }
  std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>::~unique_ptr(&local_30);
  return bVar3;
}

Assistant:

bool ServerManager::addServer(std::string_view serverConfig) {
	auto server = std::make_unique<IRC_Bot>(m_config->getSection(serverConfig), m_config->getSection("Default"sv));
	if (server->connect()) {
		m_servers.push_back(std::move(server));
		return true;
	}

	return false;
}